

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_let(Parser *psr)

{
  uint64_t name_00;
  Node NVar1;
  undefined1 local_30 [8];
  Node result;
  int i;
  uint64_t name;
  Parser *psr_local;
  
  lex_next(&psr->lxr);
  lex_expect(&psr->lxr,0x114);
  name_00 = (psr->lxr).tk.field_4.ident_hash;
  result.field_1.jmp.false_list = psr->scope->first_local;
  while( true ) {
    if (psr->locals_count <= result.field_1.jmp.false_list) {
      lex_next(&psr->lxr);
      lex_expect(&psr->lxr,0x3d);
      lex_next(&psr->lxr);
      NVar1 = parse_expr(psr);
      result._0_8_ = NVar1.field_1;
      local_30._0_4_ = NVar1.type;
      expr_to_next_slot(psr,(Node *)local_30);
      psr_new_local(psr,name_00);
      return;
    }
    if (psr->locals[result.field_1.jmp.false_list].name == name_00) break;
    result.field_1.jmp.false_list = result.field_1.jmp.false_list + 1;
  }
  psr_trigger_err(psr,"variable already defined");
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                ,0x573,"void parse_let(Parser *)");
}

Assistant:

static void parse_let(Parser *psr) {
	// Skip the `let` token
	lex_next(&psr->lxr);

	// Expect an identifier
	lex_expect(&psr->lxr, TK_IDENT);
	uint64_t name = psr->lxr.tk.ident_hash;

	// Ensure another local with the same name doesn't already exist
	for (int i = psr->scope->first_local; i < psr->locals_count; i++) {
		if (psr->locals[i].name == name) {
			psr_trigger_err(psr, "variable already defined");
			UNREACHABLE();
		}
	}
	lex_next(&psr->lxr);

	// Expect `=`
	lex_expect(&psr->lxr, '=');
	lex_next(&psr->lxr);

	// Expect an expression
	Node result = parse_expr(psr);
	expr_to_next_slot(psr, &result);

	// Add a new local to the parser's locals list
	psr_new_local(psr, name);
}